

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

void Spl_ManComputeOneTest(Gia_Man_t *pGia)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *local_38;
  Vec_Int_t *vAnds;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vNodes;
  Vec_Int_t *vRoots;
  int Count;
  int iLut;
  Gia_Man_t *pGia_local;
  
  _Count = pGia;
  Gia_ManComputeOneWinStart(pGia,0x40,0);
  for (vRoots._4_4_ = 1; uVar1 = vRoots._4_4_, iVar2 = Gia_ManObjNum(_Count), (int)uVar1 < iVar2;
      vRoots._4_4_ = vRoots._4_4_ + 1) {
    iVar2 = Gia_ObjIsLut2(_Count,vRoots._4_4_);
    if (iVar2 != 0) {
      vRoots._0_4_ = Gia_ManComputeOneWin(_Count,vRoots._4_4_,&vNodes,&vLeaves,&vAnds,&local_38);
      uVar1 = vRoots._4_4_;
      uVar3 = Vec_IntSize(vAnds);
      uVar4 = Vec_IntSize(vLeaves);
      uVar5 = Vec_IntSize(vNodes);
      printf("Obj = %6d : Leaf = %2d.  Node = %2d.  Root = %2d.    AND = %3d.\n",(ulong)uVar1,
             (ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)vRoots);
    }
  }
  Gia_ManComputeOneWin
            (_Count,-1,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0);
  return;
}

Assistant:

void Spl_ManComputeOneTest( Gia_Man_t * pGia )
{
    int iLut, Count;
    Gia_ManComputeOneWinStart( pGia, 64, 0 );
    Gia_ManForEachLut2( pGia, iLut )
    {
        Vec_Int_t * vRoots, * vNodes, * vLeaves, * vAnds;
        Count = Gia_ManComputeOneWin( pGia, iLut, &vRoots, &vNodes, &vLeaves, &vAnds );
        printf( "Obj = %6d : Leaf = %2d.  Node = %2d.  Root = %2d.    AND = %3d.\n", 
            iLut, Vec_IntSize(vLeaves), Vec_IntSize(vNodes), Vec_IntSize(vRoots), Count ); 
    }
    Gia_ManComputeOneWin( pGia, -1, NULL, NULL, NULL, NULL );
}